

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O0

void pztopology::TPZPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  Fad<double> *w;
  TPZFMatrix<Fad<double>_> *this;
  TPZVec<Fad<double>_> *in_RDI;
  Fad<double> lmaymez;
  Fad<double> lmaxmez;
  Fad<double> lmeymez;
  Fad<double> lmexmez;
  Fad<double> lmez;
  Fad<double> T1yz;
  Fad<double> T1xz;
  Fad<double> T0yz;
  Fad<double> T0xz;
  Fad<double> zeta;
  Fad<double> eta;
  Fad<double> xi;
  Fad<double> *in_stack_fffffffffffff568;
  Fad<double> *in_stack_fffffffffffff570;
  Fad<double> *in_stack_fffffffffffff578;
  Fad<double> *in_stack_fffffffffffff580;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *in_stack_fffffffffffff588;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff590;
  Fad<double> *in_stack_fffffffffffff5a0;
  Fad<double> *in_stack_fffffffffffff5a8;
  Fad<double> *in_stack_fffffffffffff5b0;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffff5b8;
  Fad<double> *in_stack_fffffffffffff5c0;
  undefined1 local_a12;
  size_t in_stack_fffffffffffff988;
  char *in_stack_fffffffffffff990;
  
  TPZVec<Fad<double>_>::operator[](in_RDI,0);
  Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  TPZVec<Fad<double>_>::operator[](in_RDI,1);
  Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  TPZVec<Fad<double>_>::operator[](in_RDI,2);
  Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  bVar4 = operator><double,_double,_nullptr>
                    (in_stack_fffffffffffff570,&in_stack_fffffffffffff568->val_);
  if (bVar4) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  }
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator-<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b0);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5a8,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a0);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator-<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b0);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5a8,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a0);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator+<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  operator*<double,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b0);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5a8,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a0);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator+<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  operator*<double,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b0);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5a8,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a0);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  bVar4 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
  Fad<double>::~Fad(in_stack_fffffffffffff570);
  if (bVar4) {
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
  }
  Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  bVar4 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
  Fad<double>::~Fad(in_stack_fffffffffffff570);
  if (bVar4) {
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
  }
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  Fad<double>::Fad<FadBinaryMinus<FadCst<double>,Fad<double>>>
            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff590,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff588);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff590,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff588);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff590,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff588);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff590,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff588);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator-<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator-<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator+<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator-<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,Fad<double>>>,Fad<double>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator+<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator-<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,Fad<double>>>,Fad<double>>>
            (in_stack_fffffffffffff5c0,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5b8);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  bVar4 = false;
  Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  bVar5 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
  local_a12 = 0;
  if (bVar5) {
    Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    bVar3 = true;
    bVar5 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
    local_a12 = 0;
    if (!bVar5) {
      Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
      bVar2 = true;
      bVar5 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
      local_a12 = 0;
      if (!bVar5) {
        Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
        bVar1 = true;
        bVar5 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
        local_a12 = 0;
        if (!bVar5) {
          Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
          bVar4 = true;
          bVar5 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
          local_a12 = bVar5 ^ 0xff;
        }
      }
    }
  }
  if (bVar4) {
    Fad<double>::~Fad(in_stack_fffffffffffff570);
  }
  if (bVar1) {
    Fad<double>::~Fad(in_stack_fffffffffffff570);
  }
  if (bVar2) {
    Fad<double>::~Fad(in_stack_fffffffffffff570);
  }
  if (bVar3) {
    Fad<double>::~Fad(in_stack_fffffffffffff570);
  }
  Fad<double>::~Fad(in_stack_fffffffffffff570);
  if ((local_a12 & 1) != 0) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  }
  Fad<double>::Fad(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  bVar4 = IsZero<Fad<double>>(in_stack_fffffffffffff570);
  Fad<double>::~Fad(in_stack_fffffffffffff570);
  if (bVar4) {
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_fffffffffffff580,&in_stack_fffffffffffff578->val_);
  }
  operator*<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  operator-<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5a0);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff590,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  operator-<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5a0);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
            ((double)in_stack_fffffffffffff5b8,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  pFVar6 = TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
                      (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff590,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<double,_Fad<double>,_nullptr>((double)pFVar6,in_stack_fffffffffffff5b0);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
                      (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<double,_Fad<double>,_nullptr>((double)pFVar6,pFVar7);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0);
  pFVar8 = TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
                      (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator+<Fad<double>,_Fad<double>,_nullptr>(pFVar8,in_stack_fffffffffffff5a0);
  operator*<Fad<double>,_Fad<double>,_nullptr>(pFVar8,in_stack_fffffffffffff5a0);
  operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)pFVar8,in_stack_fffffffffffff5a0);
  operator-<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)pFVar8,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff5a0);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
            ((double)pFVar6,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)pFVar7);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)pFVar8,in_stack_fffffffffffff5a0);
  w = TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
                 (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff590,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<double,_Fad<double>,_nullptr>((double)pFVar6,pFVar7);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar8,w);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator*<double,_Fad<double>,_nullptr>((double)pFVar6,pFVar7);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar8,w);
  this = (TPZFMatrix<Fad<double>_> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
                    (int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=((Fad<double> *)this,in_stack_fffffffffffff588);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  operator+<Fad<double>,_Fad<double>,_nullptr>(pFVar8,w);
  operator*<Fad<double>,_Fad<double>,_nullptr>(pFVar8,w);
  operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)pFVar8,w);
  operator-<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)pFVar8,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)w);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
            ((double)pFVar6,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)pFVar7);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)pFVar8,w);
  pFVar6 = TPZFMatrix<Fad<double>_>::operator()
                     (this,(int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=
            ((Fad<double> *)this,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)pFVar6);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff570);
  pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                     (this,(int64_t)pFVar6,(int64_t)in_stack_fffffffffffff580);
  Fad<double>::operator=<double,_nullptr>(pFVar7,&in_stack_fffffffffffff578->val_);
  pFVar8 = TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)pFVar6,(int64_t)pFVar7);
  Fad<double>::operator=<double,_nullptr>(pFVar7,&pFVar8->val_);
  pFVar6 = TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)pFVar6,(int64_t)pFVar7);
  Fad<double>::operator=<double,_nullptr>(pFVar7,&pFVar8->val_);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  Fad<double>::~Fad(pFVar6);
  return;
}

Assistant:

inline void TPZPyramid::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T xi = loc[0], eta = loc[1] , zeta  = loc[2];

        if (zeta> 1.) {
            DebugStop();
        }

        T T0xz = .5*(1.-zeta-xi) / (1.-zeta);
        T T0yz = .5*(1.-zeta-eta) / (1.-zeta);
        T T1xz = .5*(1.-zeta+xi) / (1.-zeta);
        T T1yz = .5*(1.-zeta+eta) / (1.-zeta);
        if (IsZero(xi)) {
            T0xz = 0.5;
            T1xz = 0.5;
        }
        if (IsZero(eta)) {
            T0yz = 0.5;
            T1yz = 0.5;
        }
        T lmez = (1.-zeta);

        phi(0,0)  = T0xz*T0yz*lmez;
        phi(1,0)  = T1xz*T0yz*lmez;
        phi(2,0)  = T1xz*T1yz*lmez;
        phi(3,0)  = T0xz*T1yz*lmez;
        phi(4,0)  = zeta;

        T lmexmez = 1.-xi-zeta;
        T lmeymez = 1.-eta-zeta;
        T lmaxmez = 1.+xi-zeta;
        T lmaymez = 1.+eta-zeta;

        if (IsZero(lmez) && !IsZero(lmexmez) && !IsZero(lmeymez) &&
            !IsZero(lmaxmez) && !IsZero(lmaymez)) {
            DebugStop();
        }
        if (IsZero(lmez)) {
            lmexmez = 0.999;
            lmeymez = 0.999;
            lmaxmez = 0.999;
            lmaymez = 0.999;
            lmez = 0.001;
        }

        dphi(0,0) = -.25*lmeymez / lmez;
        dphi(1,0) = -.25*lmexmez / lmez;
        dphi(2,0) = -.25*(lmeymez+lmexmez-lmexmez*lmeymez/lmez) / lmez;
        dphi(0,1) =  .25*lmeymez / lmez;
        dphi(1,1) = -.25*lmaxmez / lmez;
        dphi(2,1) = -.25*(lmeymez+lmaxmez-lmaxmez*lmeymez/lmez) / lmez;
        dphi(0,2) =  .25*lmaymez / lmez;
        dphi(1,2) =  .25*lmaxmez / lmez;
        dphi(2,2) = -.25*(lmaymez+lmaxmez-lmaxmez*lmaymez/lmez) / lmez;
        dphi(0,3) = -.25*lmaymez / lmez;
        dphi(1,3) =  .25*lmexmez / lmez;
        dphi(2,3) = -.25*(lmaymez+lmexmez-lmexmez*lmaymez/lmez) / lmez;
        dphi(0,4) =  0.0;
        dphi(1,4) =  0.0;
        dphi(2,4) =  1.0;

    }